

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
TestCharReaderFailIfExtraTestissue107::runTestCase(TestCharReaderFailIfExtraTestissue107 *this)

{
  TestResult *pTVar1;
  int iVar2;
  Int actual;
  Value *this_00;
  CharReader *pCVar3;
  allocator local_101;
  char doc [6];
  string errs;
  string local_d8;
  string local_b8;
  Value root;
  CharReaderBuilder b;
  Value local_40;
  
  Json::CharReaderBuilder::CharReaderBuilder(&b);
  Json::Value::Value(&root,nullValue);
  builtin_strncpy(doc,"1:2:3",6);
  Json::Value::Value(&local_40,true);
  this_00 = Json::Value::operator[](&b.settings_,"failIfExtra");
  Json::Value::operator=(this_00,&local_40);
  Json::Value::~Value(&local_40);
  pCVar3 = Json::CharReaderBuilder::newCharReader(&b);
  errs._M_dataplus._M_p = (pointer)&errs.field_2;
  errs._M_string_length = 0;
  errs.field_2._M_local_buf[0] = '\0';
  iVar2 = (*pCVar3->_vptr_CharReader[2])(pCVar3,doc,doc + 5,&root,&errs);
  if ((char)iVar2 != '\0') {
    JsonTest::TestResult::addFailure
              ((this->super_CharReaderFailIfExtraTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0x7b4,"!ok");
  }
  pTVar1 = (this->super_CharReaderFailIfExtraTest).super_TestCase.result_;
  std::__cxx11::string::string
            ((string *)&local_b8,"* Line 1, Column 2\n  Extra non-whitespace after JSON value.\n",
             &local_101);
  std::__cxx11::string::string((string *)&local_d8,(string *)&errs);
  JsonTest::checkStringEqual
            (pTVar1,&local_b8,&local_d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x7b8,
             "\"* Line 1, Column 2\\n\" \"  Extra non-whitespace after JSON value.\\n\" == errs");
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  pTVar1 = (this->super_CharReaderFailIfExtraTest).super_TestCase.result_;
  actual = Json::Value::asInt(&root);
  JsonTest::checkEqual<int,int>
            (pTVar1,1,actual,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x7b9,"1 == root.asInt()");
  (*pCVar3->_vptr_CharReader[1])(pCVar3);
  std::__cxx11::string::~string((string *)&errs);
  Json::Value::~Value(&root);
  Json::CharReaderBuilder::~CharReaderBuilder(&b);
  return;
}

Assistant:

JSONTEST_FIXTURE(CharReaderFailIfExtraTest, issue107) {
  // This is interpretted as an int value followed by a colon.
  Json::CharReaderBuilder b;
  Json::Value root;
  char const doc[] =
      "1:2:3";
  b.settings_["failIfExtra"] = true;
  Json::CharReader* reader(b.newCharReader());
  std::string errs;
  bool ok = reader->parse(
      doc, doc + std::strlen(doc),
      &root, &errs);
  JSONTEST_ASSERT(!ok);
  JSONTEST_ASSERT_STRING_EQUAL(
      "* Line 1, Column 2\n"
      "  Extra non-whitespace after JSON value.\n",
      errs);
  JSONTEST_ASSERT_EQUAL(1, root.asInt());
  delete reader;
}